

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evolution-test.c++
# Opt level: O3

Orphan<capnp::DynamicValue> * __thiscall
capnp::compiler::anon_unknown_0::makeExampleValue
          (Orphan<capnp::DynamicValue> *__return_storage_ptr__,anon_unknown_0 *this,
          Orphanage orphanage,uint ordinal,Type type,uint sharedOrdinalCount)

{
  ulong uVar1;
  Type type_00;
  Field field_00;
  Field field_01;
  OrphanBuilder *builder_00;
  BuilderArena *this_00;
  CapTableBuilder *pCVar2;
  StructSchema SVar3;
  SegmentBuilder *pSVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  Orphan<capnp::DynamicValue> *pOVar8;
  EnumSchema EVar9;
  Orphan<capnp::DynamicValue> *extraout_RAX;
  Orphan<capnp::DynamicValue> *extraout_RAX_00;
  Orphan<capnp::DynamicValue> *extraout_RAX_01;
  undefined4 extraout_var;
  Orphan<capnp::DynamicValue> *extraout_RAX_02;
  Orphan<capnp::DynamicValue> *extraout_RAX_03;
  undefined4 in_register_00000084;
  undefined4 in_register_0000008c;
  StringPtr name;
  Orphanage orphanage_00;
  StringPtr name_00;
  Orphanage orphanage_01;
  ListSchema schema;
  Type TVar10;
  StructSchema structType;
  Field field;
  Orphan<capnp::DynamicList> result_1;
  Builder builder;
  Orphan<capnp::DynamicStruct> result;
  undefined8 in_stack_fffffffffffffd78;
  anon_union_8_2_eba6ea51_for_Type_5 in_stack_fffffffffffffd80;
  uint local_23c;
  Orphanage local_238;
  Schema local_228;
  Orphan<capnp::DynamicValue> local_220;
  undefined7 uStack_1e8;
  undefined8 uStack_1e1;
  undefined1 local_1d8 [8];
  anon_union_64_12_1c583c3a_for_Reader_1 aStack_1d0;
  Type local_190;
  Orphan<capnp::DynamicValue> local_180;
  Builder local_148;
  Orphan<capnp::DynamicStruct> local_110;
  undefined8 local_e8;
  ulong uStack_e0;
  size_t local_d8;
  SegmentReader *pSStack_d0;
  CapTableReader *local_c8;
  byte *pbStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  ulong local_a8;
  size_t sStack_a0;
  SegmentReader *local_98;
  CapTableReader *pCStack_90;
  byte *local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  StructReader local_58;
  
  local_190.field_4.scopeId._4_4_ = in_register_0000008c;
  local_190.field_4.scopeId._0_4_ = sharedOrdinalCount;
  local_190._4_4_ = in_register_00000084;
  local_190._0_4_ = ordinal;
  local_238.capTable = (CapTableBuilder *)orphanage.arena;
  uVar6 = 0xe;
  if ((ordinal & 0xff0000) == 0) {
    uVar6 = ordinal;
  }
  orphanage_01.capTable._0_4_ = (uint)orphanage.capTable;
  uVar5 = (uVar6 & 0xffff) - 1;
  local_23c = (uint)orphanage_01.capTable;
  local_238.arena = (BuilderArena *)this;
  if (0xf < uVar5) {
switchD_00150c0c_caseD_3:
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[37]>
              ((Fault *)local_1d8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compiler/evolution-test.c++"
               ,0x1ff,FAILED,(char *)0x0,"\"You added a new possible field type!\"",
               (char (*) [37])"You added a new possible field type!");
    kj::_::Debug::Fault::fatal((Fault *)local_1d8);
  }
  pOVar8 = (Orphan<capnp::DynamicValue> *)
           ((long)&switchD_00150c0c::switchdataD_001c4098 +
           (long)(int)(&switchD_00150c0c::switchdataD_001c4098)[uVar5]);
  switch(uVar6 & 0xffff) {
  case 1:
    __return_storage_ptr__->type = BOOL;
    (__return_storage_ptr__->field_1).boolValue = (bool)(~(byte)orphanage.capTable & 1);
    break;
  case 2:
    __return_storage_ptr__->type = INT;
    pOVar8 = (Orphan<capnp::DynamicValue> *)(long)(int)(((uint)orphanage_01.capTable & 0xff) - 0x80)
    ;
    goto LAB_00150e0c;
  default:
    goto switchD_00150c0c_caseD_3;
  case 4:
    uVar6 = (uint)orphanage_01.capTable * 0xb8df;
    goto LAB_00150df5;
  case 7:
    uVar6 = (uint)orphanage_01.capTable * 0xd;
LAB_00150df5:
    pOVar8 = (Orphan<capnp::DynamicValue> *)(ulong)uVar6;
    __return_storage_ptr__->type = UINT;
LAB_00150e0c:
    *(Orphan<capnp::DynamicValue> **)&__return_storage_ptr__->field_1 = pOVar8;
    break;
  case 0xb:
    pOVar8 = (Orphan<capnp::DynamicValue> *)(ulong)(uint)orphanage_01.capTable;
    __return_storage_ptr__->type = FLOAT;
    (__return_storage_ptr__->field_1).floatValue = (double)(long)pOVar8 * 313.25;
    break;
  case 0xc:
    kj::str<unsigned_int&>((String *)&local_148,(kj *)&local_23c,(uint *)local_238.capTable);
    _::OrphanBuilder::copy((EVP_PKEY_CTX *)local_1d8,(EVP_PKEY_CTX *)local_238.arena);
    local_220.field_1.intValue._0_7_ = (undefined7)aStack_1d0.intValue;
    local_220.field_1.intValue._7_1_ = (undefined1)((ulong)aStack_1d0._0_8_ >> 0x38);
    local_220.field_1._8_7_ = (undefined7)aStack_1d0.textValue.super_StringPtr.content.size_;
    local_220.field_1._15_1_ = (undefined1)((ulong)aStack_1d0._8_8_ >> 0x38);
    local_220.builder.tag.content._0_7_ = SUB87(aStack_1d0.listValue.reader.segment,0);
    local_220.builder.tag.content._7_1_ = (undefined1)((ulong)aStack_1d0._16_8_ >> 0x38);
    local_220._0_7_ = SUB87(CONCAT44(local_1d8._4_4_,local_1d8._0_4_),0);
    local_220._7_1_ = SUB41(local_1d8._4_4_,3);
    _::OrphanBuilder::asText((Builder *)&local_180,(OrphanBuilder *)&local_220);
    aStack_1d0._16_8_ = local_180.field_1._8_8_;
    aStack_1d0.intValue = local_180._0_8_;
    aStack_1d0.textValue.super_StringPtr.content.size_ = local_180.field_1.intValue;
    local_1d8._0_4_ = TEXT;
    Orphan<capnp::DynamicValue>::Orphan
              (__return_storage_ptr__,(Builder *)local_1d8,(OrphanBuilder *)&local_220);
    DynamicValue::Builder::~Builder((Builder *)local_1d8);
    pOVar8 = extraout_RAX_00;
    if (CONCAT17(local_220.field_1.intValue._7_1_,local_220.field_1.intValue._0_7_) != 0) {
      _::OrphanBuilder::euthanize((OrphanBuilder *)&local_220);
      pOVar8 = extraout_RAX_01;
    }
    pSVar4 = local_148.builder.segment;
    SVar3.super_Schema.raw = (Schema)(Schema)local_148.schema;
    if (local_148.schema.super_Schema.raw == (RawBrandedSchema *)0x0) {
      return pOVar8;
    }
    local_148.schema.super_Schema.raw = (Schema)(RawBrandedSchema *)0x0;
    local_148.builder.segment = (SegmentBuilder *)0x0;
    iVar7 = (**((local_148.builder.capTable)->super_CapTableReader)._vptr_CapTableReader)
                      (local_148.builder.capTable,SVar3.super_Schema.raw,1,pSVar4,pSVar4,0);
    return (Orphan<capnp::DynamicValue> *)CONCAT44(extraout_var,iVar7);
  case 0xe:
    schema = Type::asList(&local_190);
    Orphanage::newOrphan((Orphan<capnp::DynamicList> *)&local_180,&local_238,schema,1);
    Orphan<capnp::DynamicList>::get((Builder *)local_1d8,(Orphan<capnp::DynamicList> *)&local_180);
    TVar10.field_4.schema = in_stack_fffffffffffffd80.schema;
    TVar10.baseType = (short)in_stack_fffffffffffffd78;
    TVar10.listDepth = (char)((ulong)in_stack_fffffffffffffd78 >> 0x10);
    TVar10.isImplicitParam = (bool)(char)((ulong)in_stack_fffffffffffffd78 >> 0x18);
    TVar10.field_3 =
         (anon_union_2_2_d12d5221_for_Type_3)(short)((ulong)in_stack_fffffffffffffd78 >> 0x20);
    TVar10._6_2_ = (short)((ulong)in_stack_fffffffffffffd78 >> 0x30);
    orphanage_00.capTable._0_4_ = local_23c;
    orphanage_00.arena = (BuilderArena *)local_238.capTable;
    orphanage_00.capTable._4_4_ = 0;
    makeExampleValue(&local_220,(anon_unknown_0 *)local_238.arena,orphanage_00,
                     schema.elementType._0_4_,TVar10,schema.elementType.field_4._0_4_);
    DynamicList::Builder::adopt((Builder *)local_1d8,0,&local_220);
    if (CONCAT17(local_220.builder.segment._7_1_,local_220.builder.segment._0_7_) != 0) {
      _::OrphanBuilder::euthanize(&local_220.builder);
    }
    Orphan<capnp::DynamicList>::get((Builder *)&local_220,(Orphan<capnp::DynamicList> *)&local_180);
    aStack_1d0.intValue = CONCAT17(local_220._7_1_,local_220._0_7_);
    aStack_1d0.textValue.super_StringPtr.content.size_ =
         CONCAT17(local_220.field_1.intValue._7_1_,local_220.field_1.intValue._0_7_);
    aStack_1d0._23_1_ = local_220.field_1._15_1_;
    aStack_1d0._16_7_ = local_220.field_1._8_7_;
    aStack_1d0.listValue.reader.capTable =
         (CapTableReader *)
         CONCAT17(local_220.builder.tag.content._7_1_,(undefined7)local_220.builder.tag.content);
    aStack_1d0.listValue.reader.ptr =
         (byte *)CONCAT17(local_220.builder.segment._7_1_,local_220.builder.segment._0_7_);
    aStack_1d0._40_8_ = CONCAT17(local_220.builder.capTable._7_1_,local_220.builder.capTable._0_7_);
    local_1d8._0_4_ = LIST;
    builder_00 = (OrphanBuilder *)((long)&local_180 + 0x10);
    Orphan<capnp::DynamicValue>::Orphan(__return_storage_ptr__,(Builder *)local_1d8,builder_00);
    DynamicValue::Builder::~Builder((Builder *)local_1d8);
    pOVar8 = extraout_RAX;
    local_110.builder.segment = (SegmentBuilder *)local_180.builder.tag.content;
    goto joined_r0x0015117d;
  case 0xf:
    EVar9 = Type::asEnum(&local_190);
    local_220._0_7_ = EVar9.super_Schema.raw._0_7_;
    local_220._7_1_ = EVar9.super_Schema.raw._7_1_;
    EnumSchema::getEnumerants((EnumerantList *)local_1d8,(EnumSchema *)&local_220);
    uVar1 = (ulong)(uint)orphanage_01.capTable %
            ((ulong)aStack_1d0.listValue.reader.capTable & 0xffffffff);
    pOVar8 = (Orphan<capnp::DynamicValue> *)
             _::ListReader::getStructElement
                       (&local_58,(ListReader *)&((Reader *)local_1d8)->field_1,(ElementCount)uVar1)
    ;
    __return_storage_ptr__->type = ENUM;
    (__return_storage_ptr__->field_1).intValue = CONCAT44(local_1d8._4_4_,local_1d8._0_4_);
    (__return_storage_ptr__->field_1).enumValue.value = (uint16_t)uVar1;
    break;
  case 0x10:
    local_228.raw = (RawBrandedSchema *)Type::asStruct(&local_190);
    Orphanage::newOrphan(&local_110,&local_238,(StructSchema)local_228.raw);
    Orphan<capnp::DynamicStruct>::get(&local_148,&local_110);
    name.content.size_ = 2;
    name.content.ptr = "i";
    StructSchema::findFieldByName
              ((Maybe<capnp::StructSchema::Field> *)local_1d8,(StructSchema *)&local_228,name);
    if (local_1d8[0] == VOID) {
      local_220.builder.location._7_1_ = (undefined1)aStack_1d0._48_8_;
      uStack_1e8 = (undefined7)((ulong)aStack_1d0._48_8_ >> 8);
      uStack_1e1 = aStack_1d0._56_8_;
      local_220.builder.segment._7_1_ = SUB81(aStack_1d0.listValue.reader.ptr,0);
      local_220.builder.capTable._0_7_ = (undefined7)((ulong)aStack_1d0._32_8_ >> 8);
      local_220.builder.capTable._7_1_ = (undefined1)aStack_1d0._40_8_;
      local_220.builder.location._0_7_ = (undefined7)((ulong)aStack_1d0._40_8_ >> 8);
      local_220.field_1._15_1_ = SUB81(aStack_1d0.listValue.reader.segment,0);
      local_220.builder.tag.content._0_7_ = (undefined7)((ulong)aStack_1d0._16_8_ >> 8);
      local_220.builder.tag.content._7_1_ = SUB81(aStack_1d0.listValue.reader.capTable,0);
      local_220.builder.segment._0_7_ = (undefined7)((ulong)aStack_1d0._24_8_ >> 8);
      local_220._7_1_ = SUB81(aStack_1d0.intValue,0);
      local_220.field_1.intValue._0_7_ = (undefined7)((ulong)aStack_1d0._0_8_ >> 8);
      local_220.field_1.intValue._7_1_ =
           (undefined1)aStack_1d0.textValue.super_StringPtr.content.size_;
      local_220.field_1._8_7_ = (undefined7)((ulong)aStack_1d0._8_8_ >> 8);
      local_a8 = aStack_1d0.intValue;
      sStack_a0 = aStack_1d0.textValue.super_StringPtr.content.size_;
      local_98 = aStack_1d0.listValue.reader.segment;
      pCStack_90 = aStack_1d0.listValue.reader.capTable;
      local_88 = aStack_1d0.listValue.reader.ptr;
      uStack_80 = aStack_1d0._40_8_;
      local_78 = aStack_1d0._48_8_;
      uStack_70 = aStack_1d0._56_8_;
      local_1d8._0_4_ = UINT;
      field_00._8_8_ = aStack_1d0.textValue.super_StringPtr.content.size_;
      field_00.parent.super_Schema.raw = (Schema)(Schema)aStack_1d0.intValue;
      field_00.proto._reader.segment = aStack_1d0.listValue.reader.segment;
      field_00.proto._reader.capTable = aStack_1d0.listValue.reader.capTable;
      field_00.proto._reader.data = aStack_1d0.listValue.reader.ptr;
      field_00.proto._reader.pointers = (WirePointer *)aStack_1d0._40_8_;
      field_00.proto._reader.dataSize = aStack_1d0.listValue.reader.structDataSize;
      field_00.proto._reader.pointerCount = aStack_1d0.listValue.reader.structPointerCount;
      field_00.proto._reader._38_2_ = aStack_1d0._54_2_;
      field_00.proto._reader._40_8_ = aStack_1d0._56_8_;
      aStack_1d0.intValue = (ulong)(uint)orphanage_01.capTable;
      DynamicStruct::Builder::set(&local_148,field_00,(Reader *)local_1d8);
      DynamicValue::Reader::~Reader((Reader *)local_1d8);
    }
    else {
      name_00.content.size_ = 3;
      name_00.content.ptr = "f0";
      StructSchema::getFieldByName((Field *)local_1d8,(StructSchema *)&local_228,name_00);
      pCVar2 = local_238.capTable;
      this_00 = local_238.arena;
      local_e8 = CONCAT44(local_1d8._4_4_,local_1d8._0_4_);
      local_b8 = aStack_1d0._40_8_;
      uStack_b0 = aStack_1d0._48_8_;
      local_c8 = aStack_1d0.listValue.reader.capTable;
      pbStack_c0 = aStack_1d0.listValue.reader.ptr;
      local_d8 = aStack_1d0.textValue.super_StringPtr.content.size_;
      pSStack_d0 = aStack_1d0.listValue.reader.segment;
      uStack_e0 = aStack_1d0.intValue;
      TVar10 = StructSchema::Field::getType((Field *)local_1d8);
      type_00.field_4.schema = in_stack_fffffffffffffd80.schema;
      type_00.baseType = (short)in_stack_fffffffffffffd78;
      type_00.listDepth = (char)((ulong)in_stack_fffffffffffffd78 >> 0x10);
      type_00.isImplicitParam = (bool)(char)((ulong)in_stack_fffffffffffffd78 >> 0x18);
      type_00.field_3 =
           (anon_union_2_2_d12d5221_for_Type_3)(short)((ulong)in_stack_fffffffffffffd78 >> 0x20);
      type_00._6_2_ = (short)((ulong)in_stack_fffffffffffffd78 >> 0x30);
      orphanage_01.arena = (BuilderArena *)pCVar2;
      orphanage_01.capTable._4_4_ = 0;
      makeExampleValue(&local_180,(anon_unknown_0 *)this_00,orphanage_01,TVar10._0_4_,type_00,
                       TVar10.field_4._0_4_);
      field_01._8_8_ = uStack_e0;
      field_01.parent.super_Schema.raw = (Schema)(Schema)local_e8;
      field_01.proto._reader.segment = (SegmentReader *)local_d8;
      field_01.proto._reader.capTable = (CapTableReader *)pSStack_d0;
      field_01.proto._reader.data = local_c8;
      field_01.proto._reader.pointers = (WirePointer *)pbStack_c0;
      field_01.proto._reader.dataSize = (undefined4)local_b8;
      field_01.proto._reader.pointerCount = local_b8._4_2_;
      field_01.proto._reader._38_2_ = local_b8._6_2_;
      field_01.proto._reader._40_8_ = uStack_b0;
      DynamicStruct::Builder::adopt(&local_148,field_01,&local_180);
      if (local_180.builder.segment != (SegmentBuilder *)0x0) {
        _::OrphanBuilder::euthanize(&local_180.builder);
      }
    }
    Orphan<capnp::DynamicStruct>::get((Builder *)&local_220,&local_110);
    aStack_1d0.intValue = CONCAT17(local_220._7_1_,local_220._0_7_);
    aStack_1d0.textValue.super_StringPtr.content.size_ =
         CONCAT17(local_220.field_1.intValue._7_1_,local_220.field_1.intValue._0_7_);
    aStack_1d0._23_1_ = local_220.field_1._15_1_;
    aStack_1d0._16_7_ = local_220.field_1._8_7_;
    aStack_1d0.listValue.reader.capTable =
         (CapTableReader *)
         CONCAT17(local_220.builder.tag.content._7_1_,(undefined7)local_220.builder.tag.content);
    aStack_1d0.listValue.reader.ptr =
         (byte *)CONCAT17(local_220.builder.segment._7_1_,local_220.builder.segment._0_7_);
    aStack_1d0._40_8_ = CONCAT17(local_220.builder.capTable._7_1_,local_220.builder.capTable._0_7_);
    local_1d8._0_4_ = STRUCT;
    builder_00 = &local_110.builder;
    Orphan<capnp::DynamicValue>::Orphan(__return_storage_ptr__,(Builder *)local_1d8,builder_00);
    DynamicValue::Builder::~Builder((Builder *)local_1d8);
    pOVar8 = extraout_RAX_02;
joined_r0x0015117d:
    if (local_110.builder.segment == (SegmentBuilder *)0x0) {
      return pOVar8;
    }
    _::OrphanBuilder::euthanize(builder_00);
    return extraout_RAX_03;
  }
  (__return_storage_ptr__->builder).tag.content = 0;
  (__return_storage_ptr__->builder).segment = (SegmentBuilder *)0x0;
  (__return_storage_ptr__->builder).capTable = (CapTableBuilder *)0x0;
  (__return_storage_ptr__->builder).location = (word *)0x0;
  return pOVar8;
}

Assistant:

Orphan<DynamicValue> makeExampleValue(
    Orphanage orphanage, uint ordinal, Type type, uint sharedOrdinalCount) {
  switch (type.which()) {
    case schema::Type::INT32: return ordinal * 47327;
    case schema::Type::FLOAT64: return ordinal * 313.25;
    case schema::Type::INT8: return int(ordinal % 256) - 128;
    case schema::Type::UINT16: return ordinal * 13;
    case schema::Type::BOOL: return ordinal % 2 == 0;
    case schema::Type::TEXT: return orphanage.newOrphanCopy(Text::Reader(kj::str(ordinal)));
    case schema::Type::STRUCT: {
      auto structType = type.asStruct();
      auto result = orphanage.newOrphan(structType);
      auto builder = result.get();

      KJ_IF_MAYBE(fieldI, structType.findFieldByName("i")) {
        // Type is "StructType"
        builder.set(*fieldI, ordinal);
      } else {
        // Type is "Int32Struct" or the like.
        auto field = structType.getFieldByName("f0");
        builder.adopt(field, makeExampleValue(
            orphanage, ordinal, field.getType(), sharedOrdinalCount));
      }

      return kj::mv(result);
    }
    case schema::Type::ENUM: {
      auto enumerants = type.asEnum().getEnumerants();
      return DynamicEnum(enumerants[ordinal %enumerants.size()]);
    }
    case schema::Type::LIST: {
      auto listType = type.asList();
      auto elementType = listType.getElementType();
      auto result = orphanage.newOrphan(listType, 1);
      result.get().adopt(0, makeExampleValue(
          orphanage, ordinal, elementType, sharedOrdinalCount));
      return kj::mv(result);
    }
    default:
      KJ_FAIL_ASSERT("You added a new possible field type!");
  }